

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_unusedcode.c
# Opt level: O0

int process_block(LinearizerState *linearizer,Proc *proc,BasicBlock *bb)

{
  uint32_t uVar1;
  nodeId_t nVar2;
  GraphNode *n;
  GraphNodeList *pGVar3;
  void *ptr;
  uint local_58;
  uint local_54;
  uint32_t i_1;
  uint32_t i;
  nodeId_t *nodes;
  uint32_t count;
  GraphNodeList *successors;
  GraphNodeList *predecessors;
  GraphNode *node;
  BasicBlock *bb_local;
  Proc *proc_local;
  LinearizerState *linearizer_local;
  
  n = raviX_graph_node(proc->cfg,bb->index);
  pGVar3 = raviX_predecessors(n);
  uVar1 = raviX_node_list_size(pGVar3);
  if (uVar1 == 0) {
    pGVar3 = raviX_successors(n);
    uVar1 = raviX_node_list_size(pGVar3);
    if (uVar1 == 0) {
      linearizer_local._4_4_ = 0;
    }
    else {
      ptr = raviX_realloc_array((void *)0x0,4,0,(ulong)uVar1);
      for (local_54 = 0; local_54 < uVar1; local_54 = local_54 + 1) {
        nVar2 = raviX_node_list_at(pGVar3,local_54);
        *(nodeId_t *)((long)ptr + (ulong)local_54 * 4) = nVar2;
      }
      for (local_58 = 0; local_58 < uVar1; local_58 = local_58 + 1) {
        raviX_delete_edge(proc->cfg,bb->index,*(nodeId_t *)((long)ptr + (ulong)local_58 * 4));
      }
      raviX_free(ptr);
      uVar1 = raviX_node_list_size(pGVar3);
      if (uVar1 != 0) {
        __assert_fail("raviX_node_list_size(successors) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/opt_unusedcode.c"
                      ,0x40,"int process_block(LinearizerState *, Proc *, BasicBlock *)");
      }
      raviX_ptrlist_remove_all((PtrList **)&bb->insns);
      linearizer_local._4_4_ = 1;
    }
  }
  else {
    linearizer_local._4_4_ = 0;
  }
  return linearizer_local._4_4_;
}

Assistant:

static int process_block(LinearizerState *linearizer, Proc *proc, BasicBlock *bb)
{
	GraphNode *node = raviX_graph_node(proc->cfg, bb->index);
	GraphNodeList *predecessors = raviX_predecessors(node);
	if (raviX_node_list_size(predecessors) != 0) {
		// Has predecessors so nothing to do
		return 0;
	}
	// No predecessor blocks, so we can remove this block
	GraphNodeList *successors = raviX_successors(node);
	uint32_t count = raviX_node_list_size(successors);
	if (count == 0) {
		// Nothing to do, but odd?
		// FIXME maybe assert?
		return 0;
	}
	// Make a copy of the successor node list as we need to change the CFG
	nodeId_t *nodes = (nodeId_t *) raviX_realloc_array(NULL, sizeof(nodeId_t), 0, count);
	for (uint32_t i = 0; i < count; i++) {
		nodes[i] = raviX_node_list_at(successors, i);
	}
	for (uint32_t i = 0; i < count; i++) {
		// Remove edge from bb to the successor node
		raviX_delete_edge(proc->cfg, bb->index, nodes[i]);
	}
	raviX_free(nodes);
	assert(raviX_node_list_size(successors) == 0); // All should be gone
	// Now clear out this bb
	// FIXME deallocate instructions
	raviX_ptrlist_remove_all((PtrList **)&bb->insns);
	// FIXME do we deallocate bb?
	return 1; // We changed something
}